

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::ExtensionRangeOptions::_InternalParse
          (ExtensionRangeOptions *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  char cVar5;
  UninterpretedOption *msg;
  uint32 res;
  uint tag;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_bool> pVar7;
  
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar7._8_8_ = 0;
      pVar7.first = ptr;
    }
    else {
      pVar7._8_8_ = 1;
      pVar7.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar7 = internal::EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar7.first;
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    pVar6.second._0_1_ = bVar1;
    pVar6.first = (char *)(p + 1);
    pVar6._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar6 = internal::ReadTagFallback((char *)p,res);
      }
      else {
        pVar6.second = res;
        pVar6.first = (char *)(p + 2);
        pVar6._12_4_ = 0;
      }
    }
    ptr = pVar6.first;
    if ((short *)ptr == (short *)0x0) {
LAB_002f5a6c:
      cVar5 = '\x04';
    }
    else {
      tag = pVar6.second;
      if (tag == 0x1f3a) {
        ptr = (char *)((long)ptr + -2);
        do {
          pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_002f599c:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
                       (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f59aa:
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar4->elements[iVar3] = msg;
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar3) {
              if (pRVar4->allocated_size ==
                  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_002f599c;
              goto LAB_002f59aa;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption *)pRVar4->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                          (ctx,msg,(char *)((long)ptr + 2));
          if ((short *)ptr == (short *)0x0) goto LAB_002f5a6c;
          cVar5 = '\x02';
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*(short *)ptr == 0x3eba));
      }
      else if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar5 = '\t';
      }
      else {
        if (tag < 8000) {
          ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
        }
        else {
          ptr = internal::ExtensionSet::ParseField
                          (&this->_extensions_,pVar6._8_8_ & 0xffffffff,ptr,
                           (Message *)_ExtensionRangeOptions_default_instance_,
                           &this->_internal_metadata_,ctx);
        }
        cVar5 = ((short *)ptr == (short *)0x0) * '\x02' + '\x02';
      }
    }
    if (cVar5 != '\x02') {
      if (cVar5 == '\x04') {
        ptr = (char *)0x0;
      }
      return (char *)(short *)ptr;
    }
  } while( true );
}

Assistant:

const char* ExtensionRangeOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}